

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::ModuleHeaderSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x15a) {
    if ((kind != InterfaceHeader) && (kind != ModuleHeader)) {
      return false;
    }
  }
  else if ((kind != PackageHeader) && (kind != ProgramHeader)) {
    return false;
  }
  return true;
}

Assistant:

bool ModuleHeaderSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::InterfaceHeader:
        case SyntaxKind::ModuleHeader:
        case SyntaxKind::PackageHeader:
        case SyntaxKind::ProgramHeader:
            return true;
        default:
            return false;
    }
}